

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O1

void irr::video::CColorConverter::convert_viaFormat
               (void *sP,ECOLOR_FORMAT sF,s32 sN,void *dP,ECOLOR_FORMAT dF)

{
  ushort uVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  long lVar5;
  
  switch(sF) {
  case ECF_A1R5G5B5:
    switch(dF) {
    case ECF_A1R5G5B5:
switchD_001fe81f_caseD_1:
      iVar4 = sN * 2;
LAB_001fe978:
      memcpy(dP,sP,(long)iVar4);
      return;
    case ECF_R5G6B5:
      if (0 < sN) {
        lVar5 = 0;
        do {
          uVar1 = *(ushort *)((long)sP + lVar5 * 2);
          *(ushort *)((long)dP + lVar5 * 2) = (uVar1 & 0x1f) + (uVar1 & 0xffe0) * 2;
          lVar5 = lVar5 + 1;
        } while (sN != (int)lVar5);
      }
      break;
    case ECF_R8G8B8:
      if (0 < sN) {
        pbVar3 = (byte *)((long)dP + 2);
        lVar5 = 0;
        do {
          *pbVar3 = (byte)(*(ushort *)((long)sP + lVar5 * 2) >> 7) & 0xf8;
          pbVar3[-1] = (byte)(*(ushort *)((long)sP + lVar5 * 2) >> 2) & 0xf8;
          pbVar3[-2] = *(char *)((long)sP + lVar5 * 2) << 3;
          lVar5 = lVar5 + 1;
          pbVar3 = pbVar3 + 3;
        } while (sN != (int)lVar5);
      }
      break;
    case ECF_A8R8G8B8:
      convert_A1R5G5B5toA8R8G8B8(sP,sN,dP);
      return;
    }
    break;
  case ECF_R5G6B5:
    switch(dF) {
    case ECF_A1R5G5B5:
      if (0 < sN) {
        lVar5 = 0;
        do {
          uVar1 = *(ushort *)((long)sP + lVar5 * 2);
          *(ushort *)((long)dP + lVar5 * 2) = (uVar1 & 0x1f) + (uVar1 >> 1 & 0xffe0) + -0x8000;
          lVar5 = lVar5 + 1;
        } while (sN != (int)lVar5);
      }
      break;
    case ECF_R5G6B5:
      goto switchD_001fe81f_caseD_1;
    case ECF_R8G8B8:
      if (0 < sN) {
        lVar5 = 0;
        do {
          *(byte *)dP = *(byte *)((long)sP + lVar5 * 2 + 1) & 0xf8;
          *(byte *)((long)dP + 1) = (byte)(*(ushort *)((long)sP + lVar5 * 2) >> 3) & 0xfc;
          *(char *)((long)dP + 2) = *(char *)((long)sP + lVar5 * 2) << 3;
          dP = (void *)((long)dP + 3);
          lVar5 = lVar5 + 1;
        } while (sN != (int)lVar5);
      }
      break;
    case ECF_A8R8G8B8:
      if (0 < sN) {
        lVar5 = 0;
        do {
          uVar1 = *(ushort *)((long)sP + lVar5 * 2);
          *(uint *)((long)dP + lVar5 * 4) =
               ((uVar1 & 0x7e0) << 5 | (uVar1 & 0xf800) << 8) + (uVar1 & 0x1f) * 8 + -0x1000000;
          lVar5 = lVar5 + 1;
        } while (sN != (int)lVar5);
      }
    }
    break;
  case ECF_R8G8B8:
    switch(dF) {
    case ECF_A1R5G5B5:
      convert_R8G8B8toA1R5G5B5(sP,sN,dP);
      return;
    case ECF_R5G6B5:
      convert_R8G8B8toR5G6B5(sP,sN,dP);
      return;
    case ECF_R8G8B8:
      iVar4 = sN * 3;
      goto LAB_001fe978;
    case ECF_A8R8G8B8:
      if (0 < sN) {
        lVar5 = 0;
        do {
          *(uint *)((long)dP + lVar5 * 4) =
               (uint)*(byte *)((long)sP + 2) |
               (uint)*(byte *)((long)sP + 1) << 8 | (uint)*sP << 0x10 | 0xff000000;
          lVar5 = lVar5 + 1;
          sP = (void *)((long)sP + 3);
        } while (sN != (int)lVar5);
      }
    }
    break;
  case ECF_A8R8G8B8:
    switch(dF) {
    case ECF_A1R5G5B5:
      if (0 < sN) {
        lVar5 = 0;
        do {
          uVar2 = *(uint *)((long)sP + lVar5 * 4);
          *(ushort *)((long)dP + lVar5 * 2) =
               (ushort)(uVar2 >> 3) & 0x1f |
               (ushort)(uVar2 >> 6) & 0x3e0 |
               (ushort)(uVar2 >> 9) & 0x7c00 | (ushort)(uVar2 >> 0x10) & 0x8000;
          lVar5 = lVar5 + 1;
        } while (sN != (int)lVar5);
      }
      break;
    case ECF_R5G6B5:
      convert_A8R8G8B8toR5G6B5(sP,sN,dP);
      return;
    case ECF_R8G8B8:
      if (0 < sN) {
        lVar5 = 0;
        do {
          *(undefined1 *)dP = *(undefined1 *)((long)sP + lVar5 * 4 + 2);
          *(undefined1 *)((long)dP + 1) = *(undefined1 *)((long)sP + lVar5 * 4 + 1);
          *(undefined1 *)((long)dP + 2) = *(undefined1 *)((long)sP + lVar5 * 4);
          dP = (void *)((long)dP + 3);
          lVar5 = lVar5 + 1;
        } while (sN != (int)lVar5);
      }
      break;
    case ECF_A8R8G8B8:
      iVar4 = sN << 2;
      goto LAB_001fe978;
    }
  }
  return;
}

Assistant:

void CColorConverter::convert_viaFormat(const void *sP, ECOLOR_FORMAT sF, s32 sN,
		void *dP, ECOLOR_FORMAT dF)
{
	// please also update can_convert_viaFormat when adding new conversions
	switch (sF) {
	case ECF_A1R5G5B5:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_A1R5G5B5toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_A1R5G5B5toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_A1R5G5B5toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_A1R5G5B5toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_R5G6B5:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_R5G6B5toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_R5G6B5toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_R5G6B5toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_R5G6B5toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_A8R8G8B8:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_A8R8G8B8toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_A8R8G8B8toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_A8R8G8B8toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_A8R8G8B8toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;
	case ECF_R8G8B8:
		switch (dF) {
		case ECF_A1R5G5B5:
			convert_R8G8B8toA1R5G5B5(sP, sN, dP);
			break;
		case ECF_R5G6B5:
			convert_R8G8B8toR5G6B5(sP, sN, dP);
			break;
		case ECF_A8R8G8B8:
			convert_R8G8B8toA8R8G8B8(sP, sN, dP);
			break;
		case ECF_R8G8B8:
			convert_R8G8B8toR8G8B8(sP, sN, dP);
			break;

		default:
			break;
		}
		break;

	default:
		break;
	}
}